

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Shift
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,double shiftX,double shiftY)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  char *message;
  uchar *puVar7;
  uchar *puVar8;
  ImageTemplate<unsigned_char> *in_RCX;
  uint in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double in_XMM1_Qa;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint in_stack_00000008;
  int in_stack_00000010;
  uint32_t data;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint32_t realHeight;
  uint32_t emptyBottomArea;
  uint32_t emptyTopArea;
  uint32_t realWidth;
  uint32_t emptyRightArea;
  uint32_t emptyLeftArea;
  uint32_t limitY;
  uint32_t limitX;
  uint32_t coeff3;
  uint32_t coeff2;
  uint32_t coeff1;
  uint32_t coeff0;
  double coeffY;
  double coeffX;
  int32_t shiftYIntegral;
  int32_t shiftXIntegral;
  uint uVar17;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed4;
  int local_128;
  int local_124;
  uint local_120;
  uint local_11c;
  undefined8 in_stack_fffffffffffffee8;
  double dVar18;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffef0;
  double dVar19;
  undefined8 in_stack_fffffffffffffef8;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff00;
  ImageTemplate<unsigned_char> *this;
  uint32_t in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff18;
  uchar *local_e0;
  byte *local_d8;
  uchar *local_c8;
  uchar *local_c0;
  int local_6c;
  int local_68;
  
  uVar17 = in_stack_00000008;
  iVar1 = in_stack_00000010;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff00,(uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             (uint32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffee8,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18
            );
  this = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffed4,iVar1),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffecc,uVar17));
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffed4,iVar1),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffecc,uVar17));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x11fc77);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = in_XMM0_Qa;
  auVar11._8_8_ = 0x7fffffffffffffff;
  auVar11._0_8_ = 0x7fffffffffffffff;
  auVar9 = vpand_avx(auVar9,auVar11);
  auVar11 = vcvtusi2sd_avx512f(auVar11,in_stack_00000008 - 1);
  if (auVar9._0_8_ <= auVar11._0_8_) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = in_XMM1_Qa;
    auVar12._8_8_ = 0x7fffffffffffffff;
    auVar12._0_8_ = 0x7fffffffffffffff;
    auVar9 = vpand_avx(auVar10,auVar12);
    auVar11 = vcvtusi2sd_avx512f(auVar12,in_stack_00000010 + -1);
    if (auVar9._0_8_ <= auVar11._0_8_) {
      local_68 = -(int)in_XMM0_Qa;
      local_6c = -(int)in_XMM1_Qa;
      dVar19 = in_XMM0_Qa + (double)local_68;
      dVar18 = in_XMM1_Qa + (double)local_6c;
      if (0.0 < dVar19) {
        local_68 = local_68 + -1;
      }
      if (0.0 < dVar18) {
        local_6c = local_6c + -1;
      }
      if (dVar19 < 0.0) {
        dVar19 = dVar19 + 1.0;
      }
      if (dVar18 < 0.0) {
        dVar18 = dVar18 + 1.0;
      }
      auVar10 = ZEXT816(0x3fe0000000000000);
      auVar11 = ZEXT816(0x40d0000000000000);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar19 * dVar18;
      auVar9 = vfmadd213sd_fma(auVar11,auVar14,auVar10);
      iVar1 = vcvttsd2usi_avx512f(auVar9);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (1.0 - dVar19) * dVar18;
      auVar9 = vfmadd213sd_fma(auVar11,auVar15,auVar10);
      iVar2 = vcvttsd2usi_avx512f(auVar9);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = (1.0 - dVar19) * (1.0 - dVar18);
      auVar9 = vfmadd213sd_fma(auVar11,auVar16,auVar10);
      iVar3 = vcvttsd2usi_avx512f(auVar9);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar19 * (1.0 - dVar18);
      auVar9 = vfmadd213sd_fma(auVar11,auVar13,auVar10);
      iVar4 = vcvttsd2usi_avx512f(auVar9);
      uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI);
      uVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
      if ((local_68 < 0) && (in_ESI < (uint)-local_68)) {
        local_11c = -in_ESI - local_68;
      }
      else {
        local_11c = 0;
      }
      if ((local_68 < 1) || (in_ESI + in_stack_00000008 + local_68 <= uVar5 - 1)) {
        local_120 = 0;
      }
      else {
        local_120 = (in_ESI + in_stack_00000008 + local_68) - (uVar5 - 1);
      }
      if ((local_6c < 0) && (in_EDX < (uint)-local_6c)) {
        local_124 = -in_EDX - local_6c;
      }
      else {
        local_124 = 0;
      }
      if ((local_6c < 1) || (in_EDX + in_stack_00000010 + local_6c <= uVar6 - 1)) {
        local_128 = 0;
      }
      else {
        local_128 = (in_EDX + in_stack_00000010 + local_6c) - (uVar6 - 1);
      }
      uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
      uVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
      local_c0 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
      local_c8 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
      local_c8 = local_c8 + (ulong)in_R8D + (ulong)(in_R9D * uVar6);
      puVar7 = local_c8 + local_124 * uVar6;
      for (; local_c8 != puVar7; local_c8 = local_c8 + uVar6) {
        memset(local_c8,0,(ulong)in_stack_00000008);
      }
      local_c0 = local_c0 +
                 (ulong)(local_124 * uVar5) +
                 (long)(int)(local_68 + local_6c * uVar5) + (ulong)in_ESI + (ulong)(in_EDX * uVar5);
      puVar7 = local_c8 + ((in_stack_00000010 - local_124) - local_128) * uVar6;
      for (; local_c8 != puVar7; local_c8 = local_c8 + uVar6) {
        local_e0 = local_c8;
        puVar8 = local_c8 + (ulong)((in_stack_00000008 - local_11c) - local_120) + (ulong)local_11c;
        memset(local_c8,0,(ulong)local_11c);
        local_d8 = local_c0 + local_11c;
        for (; local_e0 != puVar8; local_e0 = local_e0 + 1) {
          *local_e0 = (uchar)((uint)(local_d8 + 1)[uVar5] * iVar3 +
                              (uint)local_d8[1] * iVar2 +
                              (uint)local_d8[uVar5] * iVar4 + (uint)*local_d8 * iVar1 + 0x2000 >>
                             0xe);
          local_d8 = local_d8 + 1;
        }
        memset(local_e0,0,(ulong)local_120);
        local_c0 = local_c0 + uVar5;
      }
      puVar7 = local_c8 + local_128 * uVar6;
      for (; local_c8 != puVar7; local_c8 = local_c8 + uVar6) {
        memset(local_c8,0,(ulong)in_stack_00000008);
      }
      return;
    }
  }
  message = (char *)__cxa_allocate_exception(0x28);
  imageException::imageException((imageException *)this,message);
  __cxa_throw(message,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Shift( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                uint32_t width, uint32_t height, double shiftX, double shiftY )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if ( (fabs(shiftX) > width - 1) || (fabs(shiftY) > height - 1) )
            throw imageException("Shift value by value bigger than ROI");

        // take a note that we use an opposite values
        int32_t shiftXIntegral = -static_cast<int32_t>( shiftX );
        int32_t shiftYIntegral = -static_cast<int32_t>( shiftY );

        shiftX = shiftX + shiftXIntegral;
        shiftY = shiftY + shiftYIntegral;

        if ( shiftX > 0.0 )
            --shiftXIntegral;

        if ( shiftY > 0.0 )
            --shiftYIntegral;

        const double coeffX = ( shiftX < 0.0 ) ? (1.0 + shiftX) : shiftX;
        const double coeffY = ( shiftY < 0.0 ) ? (1.0 + shiftY) : shiftY;

        // 2^23 = 8388608, 2^23 * 256 is a integer limit
        const uint32_t coeff0 = static_cast<uint32_t>((      coeffX) * (      coeffY) * 16384 + 0.5);
        const uint32_t coeff1 = static_cast<uint32_t>((1.0 - coeffX) * (      coeffY) * 16384 + 0.5);
        const uint32_t coeff2 = static_cast<uint32_t>((1.0 - coeffX) * (1.0 - coeffY) * 16384 + 0.5);
        const uint32_t coeff3 = static_cast<uint32_t>((      coeffX) * (1.0 - coeffY) * 16384 + 0.5);

        const uint32_t limitX = in.width()  - 1u; // we need 2 subsequent pixels so we cannot use last pixel
        const uint32_t limitY = in.height() - 1u;

        const uint32_t emptyLeftArea  = (shiftXIntegral < 0 && startXIn < static_cast<uint32_t>(-shiftXIntegral)) ?
                                        (static_cast<uint32_t>(-shiftXIntegral) - startXIn) : 0u;
        const uint32_t emptyRightArea = (shiftXIntegral > 0 && limitX < startXIn + width + static_cast<uint32_t>(shiftXIntegral)) ?
                                        (startXIn + width + static_cast<uint32_t>(shiftXIntegral) - limitX) : 0u;
        const uint32_t realWidth = width - emptyLeftArea - emptyRightArea;

        const uint32_t emptyTopArea    = (shiftYIntegral < 0 && startYIn < static_cast<uint32_t>(-shiftYIntegral)) ?
                                         (static_cast<uint32_t>(-shiftYIntegral) - startYIn) : 0u;
        const uint32_t emptyBottomArea = (shiftYIntegral > 0 && limitY < startYIn + height + static_cast<uint32_t>(shiftYIntegral)) ?
                                         (startYIn + height + static_cast<uint32_t>(shiftYIntegral) - limitY) : 0u;
        const uint32_t realHeight = height - emptyTopArea - emptyBottomArea;

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        inY += shiftXIntegral + shiftYIntegral * static_cast<int32_t>( rowSizeIn );

        const uint8_t * outYEnd = outY + emptyTopArea * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut )
            memset( outY, 0, width );

        inY += emptyTopArea * rowSizeIn;

        outYEnd = outY + realHeight * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut, inY+=rowSizeIn ) {
            const uint8_t * inX = inY;
            uint8_t * outX = outY;
            const uint8_t * outXEnd = outX + emptyLeftArea + realWidth;

            memset( outX, 0, emptyLeftArea );
            inX += emptyLeftArea;

            for( ; outX != outXEnd; ++outX ) {
                uint32_t data  = (*(inX))  * coeff0;
                data += (*(inX+rowSizeIn)) * coeff3;
                data += (*(++inX))         * coeff1; // here we increment inX
                data += (*(inX+rowSizeIn)) * coeff2;

                *outX = static_cast<uint8_t>((data + 8192) >> 14); // 8192 is 0.5 after calculations
            }

            memset( outX, 0, emptyRightArea );
        }

        outYEnd = outY + emptyBottomArea * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut )
            memset( outY, 0, width );
    }